

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_test.cc
# Opt level: O0

void __thiscall LexerReadIdent::Run(LexerReadIdent *this)

{
  Lexer *this_00;
  Test *pTVar1;
  bool bVar2;
  undefined1 local_60 [8];
  string ident;
  Lexer lexer;
  LexerReadIdent *this_local;
  
  this_00 = (Lexer *)((long)&ident.field_2 + 8);
  Lexer::Lexer(this_00,"foo baR baz_123 foo-bar");
  std::__cxx11::string::string((string *)local_60);
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent(this_00,(string *)local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2d,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("foo",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2e,"\"foo\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent((Lexer *)((long)&ident.field_2 + 8),(string *)local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x2f,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("baR",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x30,"\"baR\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent((Lexer *)((long)&ident.field_2 + 8),(string *)local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x31,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("baz_123",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x32,"\"baz_123\" == ident");
  pTVar1 = g_current_test;
  bVar2 = Lexer::ReadIdent((Lexer *)((long)&ident.field_2 + 8),(string *)local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x33,"lexer.ReadIdent(&ident)");
  pTVar1 = g_current_test;
  bVar2 = std::operator==("foo-bar",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/lexer_test.cc",
             0x34,"\"foo-bar\" == ident");
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

TEST(Lexer, ReadIdent) {
  Lexer lexer("foo baR baz_123 foo-bar");
  string ident;
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baR", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("baz_123", ident);
  EXPECT_TRUE(lexer.ReadIdent(&ident));
  EXPECT_EQ("foo-bar", ident);
}